

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadResourcesTest<vkt::api::(anonymous_namespace)::Device>
          (TestStatus *__return_storage_ptr__,Context *context,undefined8 param_3)

{
  int *piVar1;
  pointer pSVar2;
  long *plVar3;
  undefined8 uVar4;
  deUint32 dVar5;
  Resources *this;
  long *plVar6;
  ThreadGroupThread *this_00;
  uint uVar7;
  ulong __n;
  ulong uVar8;
  long lVar9;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  resources;
  Environment env;
  ThreadGroup threads;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  local_c8;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_b0;
  undefined8 local_a0;
  Environment local_98;
  ThreadGroup local_60;
  
  local_a0 = param_3;
  dVar5 = deGetNumAvailableLogicalCores();
  uVar7 = 8;
  if (dVar5 < 8) {
    uVar7 = dVar5;
  }
  uVar8 = 2;
  if (2 < uVar7) {
    uVar8 = (ulong)uVar7;
  }
  local_98.vkp = context->m_platformInterface;
  local_98.vkd = Context::getDeviceInterface(context);
  local_98.device = Context::getDevice(context);
  local_98.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_98.programBinaries = context->m_progCollection;
  local_98.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_98.maxResourceConsumers = 1;
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = (ulong)(uint)((int)uVar8 << 4);
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(__n);
  pSVar2 = (pointer)((long)&(local_c8.
                             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr + __n);
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_c8.
       super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar2;
  memset(local_c8.
         super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
         ._M_impl.super__Vector_impl_data._M_start,0,__n);
  local_c8.
  super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
  ThreadGroup::ThreadGroup(&local_60);
  lVar9 = 0;
  do {
    this = (Resources *)operator_new(0x1b8);
    Device::Resources::Resources(this,&local_98,(Parameters *)&local_a0);
    plVar6 = (long *)operator_new(0x20);
    pSVar2 = local_c8.
             super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(plVar6 + 1) = 0;
    *(undefined4 *)((long)plVar6 + 0xc) = 0;
    *plVar6 = (long)&PTR__SharedPtrState_00d1dc48;
    plVar6[2] = (long)this;
    *(undefined4 *)(plVar6 + 1) = 1;
    *(undefined4 *)((long)plVar6 + 0xc) = 1;
    plVar3 = *(long **)((long)&(local_c8.
                                super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar9);
    if (plVar3 != plVar6) {
      if (plVar3 != (long *)0x0) {
        LOCK();
        plVar3 = plVar3 + 1;
        *(int *)plVar3 = (int)*plVar3 + -1;
        UNLOCK();
        if ((int)*plVar3 == 0) {
          *(undefined8 *)
           ((long)&(local_c8.
                    super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9) = 0;
          (**(code **)(**(long **)((long)&(local_c8.
                                           super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                  lVar9) + 0x10))();
        }
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar2->m_state + lVar9) + 0xc);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          plVar3 = *(long **)((long)&pSVar2->m_state + lVar9);
          if (plVar3 != (long *)0x0) {
            (**(code **)(*plVar3 + 8))();
          }
          *(undefined8 *)((long)&pSVar2->m_state + lVar9) = 0;
        }
      }
      *(Resources **)((long)&pSVar2->m_ptr + lVar9) = this;
      *(long **)((long)&pSVar2->m_state + lVar9) = plVar6;
      LOCK();
      *(int *)(plVar6 + 1) = (int)plVar6[1] + 1;
      UNLOCK();
      LOCK();
      piVar1 = (int *)(*(long *)((long)&pSVar2->m_state + lVar9) + 0xc);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    LOCK();
    plVar3 = plVar6 + 1;
    *(int *)plVar3 = (int)*plVar3 + -1;
    UNLOCK();
    if ((int)*plVar3 == 0) {
      (**(code **)(*plVar6 + 0x10))(plVar6);
    }
    LOCK();
    piVar1 = (int *)((long)plVar6 + 0xc);
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(code **)(*plVar6 + 8))(plVar6);
    }
    this_00 = (ThreadGroupThread *)operator_new(0x88);
    uVar4 = *(undefined8 *)
             ((long)&(local_c8.
                      super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9);
    ThreadGroupThread::ThreadGroupThread(this_00);
    (this_00->super_Thread)._vptr_Thread = (_func_int **)&PTR__ThreadGroupThread_00d1dc88;
    this_00[1].super_Thread._vptr_Thread = (_func_int **)&local_98;
    *(undefined8 *)&this_00[1].super_Thread.m_attribs = uVar4;
    this_00[1].super_Thread.m_thread = (deThread)&local_a0;
    local_b0.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = this_00;
    ThreadGroup::add(&local_60,&local_b0);
    if (local_b0.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (ThreadGroupThread *)0x0) {
      (*((local_b0.
          super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
          .m_data.ptr)->super_Thread)._vptr_Thread[1])();
      local_b0.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    lVar9 = lVar9 + 0x10;
  } while (uVar8 << 4 != lVar9);
  ThreadGroup::run(__return_storage_ptr__,&local_60);
  de::SpinBarrier::~SpinBarrier(&local_60.m_barrier);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>_>
  ::~vector(&local_60.m_threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Device::Resources>_>_>
  ::~vector(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadResourcesTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32		numThreads	= getDefaultTestThreadCount();
	const Environment	env			(context, 1u);
	vector<ResPtr>		resources	(numThreads);
	ThreadGroup			threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		resources[ndx] = ResPtr(new typename Object::Resources(env, params));
		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(env, *resources[ndx], params)));
	}

	return threads.run();
}